

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_helper.c
# Opt level: O3

void helper_mtc0_pagegrain_mips64(CPUMIPSState_conflict5 *env,target_ulong arg1)

{
  ulong uVar1;
  
  env->CP0_PageGrain =
       ((uint)arg1 ^ env->CP0_PageGrain) & env->CP0_PageGrain_rw_bitmask ^ env->CP0_PageGrain;
  compute_hflags(env);
  if ((env->hflags & 0x4000000) == 0) {
    uVar1 = 0xfffffffff;
  }
  else {
    uVar1 = ~(-1L << ((byte)env->PABITS & 0x3f));
  }
  env->PAMask = uVar1;
  return;
}

Assistant:

void helper_mtc0_pagegrain(CPUMIPSState *env, target_ulong arg1)
{
    /* SmartMIPS not implemented */
    /* 1k pages not implemented */
    env->CP0_PageGrain = (arg1 & env->CP0_PageGrain_rw_bitmask) |
                         (env->CP0_PageGrain & ~env->CP0_PageGrain_rw_bitmask);
    compute_hflags(env);
    restore_pamask(env);
}